

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::Branch::Branch
          (Branch *this,ExclusiveJoinPromiseNode *joinNode,OwnPromiseNode *dependencyParam,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  PromiseNode *pPVar1;
  OwnPromiseNode *dependencyParam_local;
  ExclusiveJoinPromiseNode *joinNode_local;
  Branch *this_local;
  
  Event::Event(&this->super_Event,location);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_traceEvent_00c0d980;
  this->joinNode = joinNode;
  other = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(dependencyParam);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&this->dependency,other);
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])();
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,this);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::Branch(
    ExclusiveJoinPromiseNode& joinNode, OwnPromiseNode dependencyParam, SourceLocation location)
    : Event(location), joinNode(joinNode), dependency(kj::mv(dependencyParam)) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}